

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

void __thiscall Debugger::ExecuteWithSkipHook(Debugger *this,Executor *exec)

{
  bool bVar1;
  
  bVar1 = this->skipHook;
  this->skipHook = true;
  std::function<void_(lua_State_*)>::operator()(exec,this->currentL);
  this->skipHook = bVar1;
  return;
}

Assistant:

void Debugger::ExecuteWithSkipHook(const Executor &exec) {
	const bool skip = skipHook;
	skipHook = true;
	exec(currentL);
	skipHook = skip;
}